

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadClass.cpp
# Opt level: O0

void __thiscall sznet::Thread::~Thread(Thread *this)

{
  Thread *this_local;
  
  if (((this->m_started & 1U) != 0) && ((this->m_joined & 1U) == 0)) {
    sz_thread_detach(this->m_pthreadId);
  }
  CountDownLatch::~CountDownLatch(&this->m_latch);
  std::__cxx11::string::~string((string *)&this->m_name);
  std::function<void_()>::~function(&this->m_func);
  return;
}

Assistant:

Thread::~Thread()
{
	if (m_started && !m_joined)
	{
		sz_thread_detach(m_pthreadId);
	}
}